

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# select.c
# Opt level: O3

void snga_select_elem(Integer type,char *op,void *ptr,Integer elems,elem_info_t *info,Integer *ind)

{
  DoublePrecision *pDVar1;
  float fVar2;
  int iVar3;
  long lVar4;
  val_t vVar5;
  double dVar6;
  DoublePrecision DVar7;
  int iVar8;
  long lVar9;
  double *pdVar10;
  long lVar11;
  undefined4 uVar12;
  float fVar13;
  undefined4 uVar14;
  float fVar15;
  double dVar16;
  
  switch(type) {
  case 0x3e9:
    iVar8 = *ptr;
    if (((*op == 'm') && (op[1] == 'i')) && (op[2] == 'n')) {
      if (0 < elems) {
        lVar9 = 0;
        do {
          iVar3 = *(int *)((long)ptr + lVar9 * 4);
          if (iVar3 < iVar8) {
            *ind = lVar9;
            iVar8 = iVar3;
          }
          lVar9 = lVar9 + 1;
        } while (elems != lVar9);
      }
    }
    else if (0 < elems) {
      lVar9 = 0;
      do {
        iVar3 = *(int *)((long)ptr + lVar9 * 4);
        if (iVar8 < iVar3) {
          *ind = lVar9;
          iVar8 = iVar3;
        }
        lVar9 = lVar9 + 1;
      } while (elems != lVar9);
    }
    (info->v).ival = iVar8;
    return;
  case 0x3ea:
    lVar9 = *ptr;
    if (((*op == 'm') && (op[1] == 'i')) && (op[2] == 'n')) {
      if (0 < elems) {
        lVar11 = 0;
        do {
          lVar4 = *(long *)((long)ptr + lVar11 * 8);
          if (lVar4 < lVar9) {
            *ind = lVar11;
            lVar9 = lVar4;
          }
          lVar11 = lVar11 + 1;
        } while (elems != lVar11);
      }
    }
    else if (0 < elems) {
      lVar11 = 0;
      do {
        lVar4 = *(long *)((long)ptr + lVar11 * 8);
        if (lVar9 < lVar4) {
          *ind = lVar11;
          lVar9 = lVar4;
        }
        lVar11 = lVar11 + 1;
      } while (elems != lVar11);
    }
    break;
  case 0x3eb:
    fVar13 = *ptr;
    if (((*op == 'm') && (op[1] == 'i')) && (op[2] == 'n')) {
      if (0 < elems) {
        lVar9 = 0;
        do {
          fVar15 = *(float *)((long)ptr + lVar9 * 4);
          if (fVar15 < fVar13) {
            *ind = lVar9;
            fVar13 = fVar15;
          }
          lVar9 = lVar9 + 1;
        } while (elems != lVar9);
      }
    }
    else if (0 < elems) {
      lVar9 = 0;
      do {
        fVar15 = *(float *)((long)ptr + lVar9 * 4);
        if (fVar13 < fVar15) {
          *ind = lVar9;
          fVar13 = fVar15;
        }
        lVar9 = lVar9 + 1;
      } while (elems != lVar9);
    }
    (info->v).fval = fVar13;
    return;
  case 0x3ec:
    uVar12 = (undefined4)*ptr;
    uVar14 = (undefined4)((ulong)*ptr >> 0x20);
    if (((*op == 'm') && (op[1] == 'i')) && (op[2] == 'n')) {
      if (0 < elems) {
        lVar9 = 0;
        do {
          dVar6 = *(double *)((long)ptr + lVar9 * 8);
          if (dVar6 <= (double)CONCAT44(uVar14,uVar12) && (double)CONCAT44(uVar14,uVar12) != dVar6)
          {
            *ind = lVar9;
            uVar12 = SUB84(dVar6,0);
            uVar14 = (undefined4)((ulong)dVar6 >> 0x20);
          }
          lVar9 = lVar9 + 1;
        } while (elems != lVar9);
      }
    }
    else if (0 < elems) {
      lVar9 = 0;
      do {
        dVar6 = *(double *)((long)ptr + lVar9 * 8);
        if ((double)CONCAT44(uVar14,uVar12) <= dVar6 && dVar6 != (double)CONCAT44(uVar14,uVar12)) {
          *ind = lVar9;
          uVar12 = SUB84(dVar6,0);
          uVar14 = (undefined4)((ulong)dVar6 >> 0x20);
        }
        lVar9 = lVar9 + 1;
      } while (elems != lVar9);
    }
    vVar5.lval._4_4_ = uVar14;
    vVar5.ival = uVar12;
    info->v = vVar5;
    return;
  default:
    pnga_error(" wrong data type ",type);
    return;
  case 0x3ee:
    fVar13 = *ptr * *ptr + *(float *)((long)ptr + 4) * *(float *)((long)ptr + 4);
    if (((*op == 'm') && (op[1] == 'i')) && (op[2] == 'n')) {
      if (0 < elems) {
        lVar9 = 0;
        do {
          fVar15 = *(float *)((long)ptr + lVar9 * 8);
          fVar2 = *(float *)((long)ptr + lVar9 * 8 + 4);
          fVar15 = fVar15 * fVar15 + fVar2 * fVar2;
          if (fVar15 < fVar13) {
            *ind = lVar9;
            fVar13 = fVar15;
          }
          lVar9 = lVar9 + 1;
        } while (elems != lVar9);
      }
    }
    else if (0 < elems) {
      lVar9 = 0;
      do {
        fVar15 = *(float *)((long)ptr + lVar9 * 8);
        fVar2 = *(float *)((long)ptr + lVar9 * 8 + 4);
        fVar15 = fVar15 * fVar15 + fVar2 * fVar2;
        if (fVar13 < fVar15) {
          *ind = lVar9;
          fVar13 = fVar15;
        }
        lVar9 = lVar9 + 1;
      } while (elems != lVar9);
    }
    (info->v).fval = fVar13;
    info->extra2 = *(SingleComplex *)((long)ptr + *ind * 8);
    return;
  case 0x3ef:
    dVar6 = *ptr * *ptr + *(double *)((long)ptr + 8) * *(double *)((long)ptr + 8);
    if (((*op == 'm') && (op[1] == 'i')) && (op[2] == 'n')) {
      if (0 < elems) {
        lVar9 = 0;
        pdVar10 = (double *)ptr;
        do {
          dVar16 = *pdVar10 * *pdVar10 + pdVar10[1] * pdVar10[1];
          if (dVar16 < dVar6) {
            *ind = lVar9;
            dVar6 = dVar16;
          }
          lVar9 = lVar9 + 1;
          pdVar10 = pdVar10 + 2;
        } while (elems != lVar9);
      }
    }
    else if (0 < elems) {
      lVar9 = 0;
      pdVar10 = (double *)ptr;
      do {
        dVar16 = *pdVar10 * *pdVar10 + pdVar10[1] * pdVar10[1];
        if (dVar6 < dVar16) {
          *ind = lVar9;
          dVar6 = dVar16;
        }
        lVar9 = lVar9 + 1;
        pdVar10 = pdVar10 + 2;
      } while (elems != lVar9);
    }
    (info->v).dval = dVar6;
    pDVar1 = (DoublePrecision *)((long)ptr + *ind * 0x10);
    DVar7 = pDVar1[1];
    (info->extra).real = *pDVar1;
    (info->extra).imag = DVar7;
    return;
  case 0x3f8:
    lVar9 = *ptr;
    if (((*op == 'm') && (op[1] == 'i')) && (op[2] == 'n')) {
      if (0 < elems) {
        lVar11 = 0;
        do {
          lVar4 = *(long *)((long)ptr + lVar11 * 8);
          if (lVar4 < lVar9) {
            *ind = lVar11;
            lVar9 = lVar4;
          }
          lVar11 = lVar11 + 1;
        } while (elems != lVar11);
      }
    }
    else if (0 < elems) {
      lVar11 = 0;
      do {
        lVar4 = *(long *)((long)ptr + lVar11 * 8);
        if (lVar9 < lVar4) {
          *ind = lVar11;
          lVar9 = lVar4;
        }
        lVar11 = lVar11 + 1;
      } while (elems != lVar11);
    }
  }
  (info->v).lval = lVar9;
  return;
}

Assistant:

static void snga_select_elem(Integer type, char* op, void *ptr, Integer elems, elem_info_t *info,
                      Integer *ind)
{
  Integer i;
  switch (type){
    int *ia,ival;
    double *da,dval;
    DoubleComplex *ca;
    SingleComplex *cfa;
    float *fa,fval;
    long *la,lval;
    long long *lla,llval;

    case C_INT:
    ia = (int*)ptr;
    ival = *ia;
    if (strncmp(op,"min",3) == 0)
      for(i=0;i<elems;i++){ if(ival > ia[i]) {ival=ia[i];*ind=i; } } 
    else
      for(i=0;i<elems;i++){ if(ival < ia[i]) {ival=ia[i];*ind=i; } }

    info->v.ival = (int) ival;
    break;

    case C_DCPL:
    ca = (DoubleComplex*)ptr;
    dval=ca->real*ca->real + ca->imag*ca->imag;
    if (strncmp(op,"min",3) == 0)
      for(i=0;i<elems;i++, ca+=1 ){
        DoublePrecision tmp = ca->real*ca->real + ca->imag*ca->imag; 
        if(dval > tmp){dval = tmp; *ind = i;}
      }
    else
      for(i=0;i<elems;i++, ca+=1 ){
        DoublePrecision tmp = ca->real*ca->real + ca->imag*ca->imag; 
        if(dval < tmp){dval = tmp; *ind = i;}
      }

    info->v.dval = dval; /* use abs value  for comparison*/
    info->extra = ((DoubleComplex*)ptr)[*ind]; /* append the actual val */
    break;

    case C_SCPL:
       cfa = (SingleComplex*)ptr;
       fval=cfa->real*cfa->real + cfa->imag*cfa->imag;
       if (strncmp(op,"min",3) == 0)
          for(i=0;i<elems;i++, cfa+=1 ){
             float tmp = cfa->real*cfa->real + cfa->imag*cfa->imag;
             if(fval > tmp){fval = tmp; *ind = i;}
          }
       else
          for(i=0;i<elems;i++, cfa+=1 ){
             float tmp = cfa->real*cfa->real + cfa->imag*cfa->imag;
             if(fval < tmp){fval = tmp; *ind = i;}
          }

       info->v.fval = fval; /* use abs value  for comparison*/
       info->extra2 = ((SingleComplex*)ptr)[*ind]; /* append the actual val */
       break;
                                                               
    case C_DBL:
    da = (double*)ptr;
    dval = *da;
    if (strncmp(op,"min",3) == 0)
      for(i=0;i<elems;i++){ if(dval > da[i]) {dval=da[i];*ind=i; } }
    else
      for(i=0;i<elems;i++){ if(dval < da[i]) {dval=da[i];*ind=i; } }

    info->v.dval = dval; 
    break;

    case C_FLOAT:
    fa = (float*)ptr;
    fval = *fa;

    if (strncmp(op,"min",3) == 0)
      for(i=0;i<elems;i++){ if(fval > fa[i]) {fval=fa[i];*ind=i; } }
    else
      for(i=0;i<elems;i++){ if(fval < fa[i]) {fval=fa[i];*ind=i; } }

    info->v.fval = fval;
    break;
    case C_LONG:
    la = (long*)ptr;
    lval = *la;

    if (strncmp(op,"min",3) == 0)
      for(i=0;i<elems;i++){ if(lval > la[i]) {lval=la[i];*ind=i; } }
    else
      for(i=0;i<elems;i++){ if(lval < la[i]) {lval=la[i];*ind=i; } }

    info->v.lval = lval;
    break;
    case C_LONGLONG:
    lla = (long long*)ptr;
    llval = *lla;

    if (strncmp(op,"min",3) == 0)
      for(i=0;i<elems;i++){ if(llval > lla[i]) {llval=lla[i];*ind=i; } }
    else
      for(i=0;i<elems;i++){ if(llval < lla[i]) {llval=lla[i];*ind=i; } }

    info->v.llval = llval;
    break;

    default: pnga_error(" wrong data type ",type);
  }
}